

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

HaF64 __thiscall dgPolyhedra::EdgePenalty(dgPolyhedra *this,dgBigVector *pool,dgEdge *edge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  dgEdge *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  dgEdge *pdVar16;
  int iVar17;
  dgPolyhedra *this_00;
  bool bVar18;
  bool bVar19;
  dgEdge *pdVar20;
  HaF64 HVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  dgBigVector local_70;
  dgBigVector local_50;
  
  iVar7 = edge->m_incidentVertex;
  iVar17 = edge->m_next->m_incidentVertex;
  dVar27 = pool[iVar17].super_dgTemplateVector<double>.m_x -
           pool[iVar7].super_dgTemplateVector<double>.m_x;
  dVar13 = pool[iVar17].super_dgTemplateVector<double>.m_y -
           pool[iVar7].super_dgTemplateVector<double>.m_y;
  dVar14 = pool[iVar17].super_dgTemplateVector<double>.m_z -
           pool[iVar7].super_dgTemplateVector<double>.m_z;
  this_00 = (dgPolyhedra *)ABS(dVar27);
  if (((((long)this_00 < 0x7ff0000000000000) && ((long)ABS(dVar13) < 0x7ff0000000000000)) &&
      ((long)ABS(dVar14) < 0x7ff0000000000000)) &&
     ((ulong)ABS(pool[iVar17].super_dgTemplateVector<double>.m_w) < 0x7ff0000000000000)) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar27;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar13 * dVar13;
    auVar24 = vfmadd213sd_fma(auVar24,auVar24,auVar23);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar14;
    auVar24 = vfmadd213sd_fma(auVar22,auVar22,auVar24);
    if (auVar24._0_8_ < 9.999999974752427e-07) {
      return -1.0;
    }
    if ((edge->m_incidentFace < 1) || (edge->m_twin->m_incidentFace < 1)) {
LAB_0087c741:
      HVar21 = -1.0;
      pdVar16 = edge->m_twin;
      iVar7 = pdVar16->m_incidentVertex;
      dVar27 = pool[iVar7].super_dgTemplateVector<double>.m_x;
      dVar13 = pool[iVar7].super_dgTemplateVector<double>.m_y;
      dVar14 = pool[iVar7].super_dgTemplateVector<double>.m_z;
      if ((((NAN(dVar14)) || (0x7fefffffffffffff < (ulong)ABS(dVar14))) || (NAN(dVar13))) ||
         ((0x7fefffffffffffff < (ulong)ABS(dVar27) || (0x7fefffffffffffff < (ulong)ABS(dVar13))))) {
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x159,
                      "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                     );
      }
      bVar18 = false;
      bVar19 = false;
      pdVar20 = edge;
      do {
        pdVar10 = pdVar20->m_twin;
        iVar17 = pdVar10->m_incidentFace;
        if (((iVar17 == pdVar16->m_incidentFace) || (iVar17 < 0 || iVar17 == edge->m_incidentFace))
           || ((pdVar10->m_next->m_incidentFace != iVar17 ||
               (pdVar10->m_prev->m_incidentFace != iVar17)))) {
LAB_0087c9b0:
          pdVar20 = pdVar10->m_next;
          iVar17 = 0;
        }
        else {
          iVar17 = pdVar10->m_next->m_incidentVertex;
          iVar8 = pdVar10->m_incidentVertex;
          iVar9 = pdVar10->m_prev->m_incidentVertex;
          dVar11 = pool[iVar8].super_dgTemplateVector<double>.m_x;
          dVar12 = pool[iVar8].super_dgTemplateVector<double>.m_y;
          dVar1 = pool[iVar17].super_dgTemplateVector<double>.m_x;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar1;
          dVar26 = pool[iVar17].super_dgTemplateVector<double>.m_y;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = dVar26;
          dVar1 = dVar11 - dVar1;
          dVar2 = pool[iVar8].super_dgTemplateVector<double>.m_z;
          dVar3 = pool[iVar17].super_dgTemplateVector<double>.m_z;
          dVar4 = pool[iVar9].super_dgTemplateVector<double>.m_x;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = dVar4;
          dVar5 = pool[iVar9].super_dgTemplateVector<double>.m_y;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = dVar5;
          auVar22 = vsubsd_avx512f(auVar59,auVar36);
          auVar23 = vsubsd_avx512f(auVar62,auVar39);
          dVar6 = pool[iVar9].super_dgTemplateVector<double>.m_z;
          dVar15 = dVar6 - dVar3;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = dVar2 - dVar3;
          auVar24 = vmulsd_avx512f(auVar23,auVar68);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = dVar15;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar12 - dVar26;
          auVar24 = vfmsub231sd_fma(auVar24,auVar48,auVar40);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar1 * dVar15;
          auVar25 = vfmsub231sd_avx512f(auVar41,auVar22,auVar68);
          auVar22 = vmulsd_avx512f(auVar22,auVar48);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = dVar1;
          auVar22 = vfmsub231sd_avx512f(auVar22,auVar65,auVar23);
          if ((((0x7fefffffffffffff < (auVar24._0_8_ & 0x7fffffffffffffff)) ||
               (0x7fefffffffffffff < (ulong)ABS(auVar25._0_8_))) ||
              (0x7fefffffffffffff < (auVar22._0_8_ & 0x7fffffffffffffff))) ||
             (0x7fefffffffffffff < (ulong)ABS(pool[iVar8].super_dgTemplateVector<double>.m_w)))
          goto LAB_0087cc16;
          dVar11 = dVar11 - dVar27;
          dVar12 = dVar12 - dVar13;
          dVar2 = dVar2 - dVar14;
          dVar4 = dVar4 - dVar27;
          dVar5 = dVar5 - dVar13;
          dVar6 = dVar6 - dVar14;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = dVar5 * dVar2;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar12;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = dVar6;
          auVar23 = vfmsub231sd_fma(auVar51,auVar54,auVar57);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = dVar6 * dVar11;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = dVar4;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = dVar2;
          auVar50 = vfmsub231sd_fma(auVar58,auVar60,auVar67);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = dVar4 * dVar12;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = dVar5;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = dVar11;
          auVar53 = vfmsub231sd_fma(auVar55,auVar66,auVar63);
          if (((0x7fefffffffffffff < (auVar23._0_8_ & 0x7fffffffffffffff)) ||
              (0x7fefffffffffffff < (ulong)ABS(auVar50._0_8_))) ||
             (0x7fefffffffffffff < (auVar53._0_8_ & 0x7fffffffffffffff))) goto LAB_0087cc16;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = auVar50._0_8_ * auVar25._0_8_;
          auVar24 = vfmadd213sd_fma(auVar23,auVar24,auVar42);
          auVar24 = vfmadd213sd_fma(auVar53,auVar22,auVar24);
          bVar19 = bVar18;
          if (auVar24._0_8_ < 0.0) {
            bVar19 = true;
          }
          iVar17 = 6;
          bVar18 = bVar19;
          if (0.0 <= auVar24._0_8_) goto LAB_0087c9b0;
        }
      } while ((iVar17 == 0) && (pdVar20 != edge));
      if (!bVar19) {
        pdVar16 = pdVar16->m_next->m_twin->m_next;
        if (pdVar16 == edge) {
          auVar24 = ZEXT816(0x3ff0000000000000);
        }
        else {
          auVar29 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          do {
            if (0 < pdVar16->m_incidentFace) {
              iVar17 = pdVar16->m_next->m_incidentVertex;
              dVar11 = pool[iVar17].super_dgTemplateVector<double>.m_x;
              dVar12 = pool[iVar17].super_dgTemplateVector<double>.m_y;
              dVar26 = dVar11 - dVar27;
              dVar2 = dVar12 - dVar13;
              dVar1 = pool[iVar17].super_dgTemplateVector<double>.m_z;
              dVar3 = dVar1 - dVar14;
              if ((((0x7fefffffffffffff < (long)ABS(dVar26)) ||
                   (0x7fefffffffffffff < (long)ABS(dVar2))) ||
                  (0x7fefffffffffffff < (long)ABS(dVar3))) ||
                 (0x7fefffffffffffff < (ulong)ABS(pool[iVar17].super_dgTemplateVector<double>.m_w)))
              goto LAB_0087cc16;
              iVar17 = pdVar16->m_prev->m_incidentVertex;
              dVar4 = pool[iVar17].super_dgTemplateVector<double>.m_x;
              dVar5 = pool[iVar17].super_dgTemplateVector<double>.m_y;
              dVar11 = dVar4 - dVar11;
              dVar12 = dVar5 - dVar12;
              dVar6 = pool[iVar17].super_dgTemplateVector<double>.m_z;
              dVar1 = dVar6 - dVar1;
              if (((0x7fefffffffffffff < (long)ABS(dVar11)) ||
                  (0x7fefffffffffffff < (long)ABS(dVar12))) ||
                 ((0x7fefffffffffffff < (long)ABS(dVar1) ||
                  (0x7fefffffffffffff < (ulong)ABS(pool[iVar17].super_dgTemplateVector<double>.m_w))
                  ))) goto LAB_0087cc16;
              dVar4 = dVar27 - dVar4;
              dVar5 = dVar13 - dVar5;
              dVar6 = dVar14 - dVar6;
              if (((0x7fefffffffffffff < (long)ABS(dVar4)) ||
                  (0x7fefffffffffffff < (long)ABS(dVar5))) ||
                 ((0x7fefffffffffffff < (long)ABS(dVar6) ||
                  (0x7fefffffffffffff < (ulong)ABS(pool[iVar7].super_dgTemplateVector<double>.m_w)))
                 )) goto LAB_0087cc16;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = dVar26;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = dVar2 * dVar2;
              auVar24 = vfmadd213sd_fma(auVar43,auVar43,auVar49);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dVar3;
              auVar22 = vfmadd213sd_fma(auVar37,auVar37,auVar24);
              auVar44._8_8_ = 0;
              auVar44._0_8_ = dVar12 * dVar12;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = dVar11;
              auVar24 = vfmadd213sd_fma(auVar56,auVar56,auVar44);
              auVar52._8_8_ = 0;
              auVar52._0_8_ = dVar1;
              auVar23 = vfmadd213sd_fma(auVar52,auVar52,auVar24);
              auVar45._8_8_ = 0;
              auVar45._0_8_ = dVar5 * dVar5;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = dVar4;
              auVar24 = vfmadd213sd_fma(auVar61,auVar61,auVar45);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = dVar6;
              auVar25 = vfmadd213sd_fma(auVar64,auVar64,auVar24);
              auVar24 = vmaxsd_avx(auVar23,auVar22);
              auVar24 = vmaxsd_avx(auVar25,auVar24);
              auVar22 = vminsd_avx(auVar23,auVar22);
              auVar22 = vminsd_avx(auVar25,auVar22);
              auVar38._0_8_ = auVar22._0_8_ / auVar24._0_8_;
              auVar38._8_8_ = auVar22._8_8_;
              auVar24 = vminsd_avx(auVar38,auVar29._0_16_);
              auVar29 = ZEXT1664(auVar24);
            }
            auVar24 = auVar29._0_16_;
            pdVar16 = pdVar16->m_twin->m_next;
          } while (pdVar16 != edge);
        }
        if (auVar24._0_8_ < 0.0) {
          dVar27 = sqrt(auVar24._0_8_);
          return (HaF64)dVar27;
        }
        auVar24 = vsqrtsd_avx512f(auVar24,auVar24);
        HVar21 = auVar24._0_8_;
      }
      return HVar21;
    }
    FaceNormal(&local_50,this_00,edge,(HaF64 *)pool,0x20);
    FaceNormal(&local_70,this_00,edge->m_twin,(HaF64 *)pool,0x20);
    dVar14 = local_50.super_dgTemplateVector<double>.m_z;
    dVar13 = local_50.super_dgTemplateVector<double>.m_y;
    dVar27 = local_50.super_dgTemplateVector<double>.m_x;
    dVar1 = local_70.super_dgTemplateVector<double>.m_z;
    dVar12 = local_70.super_dgTemplateVector<double>.m_y;
    dVar11 = local_70.super_dgTemplateVector<double>.m_x;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_50.super_dgTemplateVector<double>.m_x;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_50.super_dgTemplateVector<double>.m_y * local_50.super_dgTemplateVector<double>.m_y;
    auVar24 = vfmadd231sd_fma(auVar25,auVar50,auVar50);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_50.super_dgTemplateVector<double>.m_z;
    auVar24 = vfmadd231sd_fma(auVar24,auVar53,auVar53);
    dVar26 = auVar24._0_8_;
    if (dVar26 < 1.0000000195414814e-24) {
      return -1.0;
    }
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_70.super_dgTemplateVector<double>.m_x;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_70.super_dgTemplateVector<double>.m_y * local_70.super_dgTemplateVector<double>.m_y;
    auVar22 = vfmadd231sd_fma(auVar46,auVar32,auVar32);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_70.super_dgTemplateVector<double>.m_z;
    auVar47 = vfmadd231sd_fma(auVar22,auVar34,auVar34);
    if (auVar47._0_8_ < 1.0000000195414814e-24) {
      return -1.0;
    }
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
      auVar47._8_8_ = 0;
    }
    else {
      auVar24 = vsqrtsd_avx(auVar24,auVar24);
      dVar26 = auVar24._0_8_;
    }
    dVar26 = 1.0 / dVar26;
    dVar27 = dVar27 * dVar26;
    dVar13 = dVar13 * dVar26;
    dVar14 = dVar14 * dVar26;
    if ((((long)ABS(dVar27) < 0x7ff0000000000000) && ((long)ABS(dVar13) < 0x7ff0000000000000)) &&
       (((long)ABS(dVar14) < 0x7ff0000000000000 &&
        ((ulong)ABS(local_50.super_dgTemplateVector<double>.m_w) < 0x7ff0000000000000)))) {
      local_50.super_dgTemplateVector<double>.m_x = dVar27;
      local_50.super_dgTemplateVector<double>.m_y = dVar13;
      local_50.super_dgTemplateVector<double>.m_z = dVar14;
      if (auVar47._0_8_ < 0.0) {
        dVar26 = sqrt(auVar47._0_8_);
      }
      else {
        auVar24 = vsqrtsd_avx(auVar47,auVar47);
        dVar26 = auVar24._0_8_;
      }
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar14;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar27;
      dVar26 = 1.0 / dVar26;
      dVar11 = dVar26 * dVar11;
      dVar12 = dVar12 * dVar26;
      dVar26 = dVar26 * dVar1;
      if (((((long)ABS(dVar11) < 0x7ff0000000000000) && ((long)ABS(dVar12) < 0x7ff0000000000000)) &&
          ((long)ABS(dVar26) < 0x7ff0000000000000)) &&
         ((ulong)ABS(local_70.super_dgTemplateVector<double>.m_w) < 0x7ff0000000000000)) {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar11;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar13 * dVar12;
        auVar24 = vfmadd213sd_fma(auVar33,auVar28,auVar31);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar26;
        auVar24 = vfmadd213sd_fma(auVar35,auVar30,auVar24);
        pdVar16 = edge;
        if (auVar24._0_8_ < -0.8999999761581421) {
          return -1.0;
        }
        do {
          if ((pdVar16->m_incidentFace < 1) || (pdVar16->m_twin->m_incidentFace < 1)) {
            pdVar16 = edge;
            do {
              if ((pdVar16->m_incidentFace < 1) || (pdVar16->m_twin->m_incidentFace < 1)) {
                bVar19 = false;
                goto LAB_0087c72c;
              }
              pdVar16 = pdVar16->m_twin->m_next;
            } while (pdVar16 != edge->m_twin);
            bVar19 = true;
LAB_0087c72c:
            if (!bVar19) {
              return -1.0;
            }
          }
          pdVar16 = pdVar16->m_twin->m_next;
          local_70.super_dgTemplateVector<double>.m_x = dVar11;
          local_70.super_dgTemplateVector<double>.m_y = dVar12;
          local_70.super_dgTemplateVector<double>.m_z = dVar26;
        } while (pdVar16 != edge);
        goto LAB_0087c741;
      }
    }
  }
LAB_0087cc16:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

hacd::HaF64 dgPolyhedra::EdgePenalty (const dgBigVector* const pool, dgEdge* const edge) const
{
	hacd::HaI32 i0 = edge->m_incidentVertex;
	hacd::HaI32 i1 = edge->m_next->m_incidentVertex;

	const dgBigVector& p0 = pool[i0];
	const dgBigVector& p1 = pool[i1];
	dgBigVector dp (p1 - p0);

	hacd::HaF64 dot = dp % dp;
	if (dot < hacd::HaF64(1.0e-6f)) {
		return hacd::HaF64 (-1.0f);
	}

	if ((edge->m_incidentFace > 0) && (edge->m_twin->m_incidentFace > 0)) {
		dgBigVector edgeNormal (FaceNormal (edge, &pool[0].m_x, sizeof (dgBigVector)));
		dgBigVector twinNormal (FaceNormal (edge->m_twin, &pool[0].m_x, sizeof (dgBigVector)));

		hacd::HaF64 mag0 = edgeNormal % edgeNormal;
		hacd::HaF64 mag1 = twinNormal % twinNormal;
		if ((mag0 < hacd::HaF64 (1.0e-24f)) || (mag1 < hacd::HaF64 (1.0e-24f))) {
			return hacd::HaF64 (-1.0f);
		}

		edgeNormal = edgeNormal.Scale (hacd::HaF64 (1.0f) / sqrt(mag0));
		twinNormal = twinNormal.Scale (hacd::HaF64 (1.0f) / sqrt(mag1));

		dot = edgeNormal % twinNormal;
		if (dot < hacd::HaF64 (-0.9f)) {
			return hacd::HaF32 (-1.0f);
		}

		dgEdge* ptr = edge;
		do {
			if ((ptr->m_incidentFace <= 0) || (ptr->m_twin->m_incidentFace <= 0)){
				dgEdge* const adj = edge->m_twin;
				ptr = edge;
				do {
					if ((ptr->m_incidentFace <= 0) || (ptr->m_twin->m_incidentFace <= 0)){
						return hacd::HaF32 (-1.0);
					}
					ptr = ptr->m_twin->m_next;
				} while (ptr != adj);
			}
			ptr = ptr->m_twin->m_next;
		} while (ptr != edge);
	}

	hacd::HaI32 faceA = edge->m_incidentFace;
	hacd::HaI32 faceB = edge->m_twin->m_incidentFace;

	i0 = edge->m_twin->m_incidentVertex;
	dgBigVector p (pool[i0].m_x, pool[i0].m_y, pool[i0].m_z, hacd::HaF32 (0.0f));

	bool penalty = false;
	dgEdge* ptr = edge;
	do {
		dgEdge* const adj = ptr->m_twin;

		hacd::HaI32 face = adj->m_incidentFace;
		if ((face != faceB) && (face != faceA) && (face >= 0) && (adj->m_next->m_incidentFace == face) && (adj->m_prev->m_incidentFace == face)){

			hacd::HaI32 i0 = adj->m_next->m_incidentVertex;
			const dgBigVector& p0 = pool[i0];

			hacd::HaI32 i1 = adj->m_incidentVertex;
			const dgBigVector& p1 = pool[i1];

			hacd::HaI32 i2 = adj->m_prev->m_incidentVertex;
			const dgBigVector& p2 = pool[i2];

			dgBigVector n0 ((p1 - p0) * (p2 - p0));
			dgBigVector n1 ((p1 - p) * (p2 - p));

//			hacd::HaF64 mag0 = n0 % n0;
//			HACD_ASSERT (mag0 > hacd::HaF64(1.0e-16f));
//			mag0 = sqrt (mag0);

//			hacd::HaF64 mag1 = n1 % n1;
//			mag1 = sqrt (mag1);

			hacd::HaF64 dot = n0 % n1;
			if (dot < hacd::HaF64 (0.0f)) {
//			if (dot <= (mag0 * mag1 * hacd::HaF32 (0.707f)) || (mag0 > (hacd::HaF64(16.0f) * mag1))) {
				penalty = true;
				break;
			}
		}

		ptr = ptr->m_twin->m_next;
	} while (ptr != edge);

	hacd::HaF64 aspect = hacd::HaF32 (-1.0f);
	if (!penalty) {
		hacd::HaI32 i0 = edge->m_twin->m_incidentVertex;
		dgBigVector p0 (pool[i0]);

		aspect = hacd::HaF32 (1.0f);
		for (dgEdge* ptr = edge->m_twin->m_next->m_twin->m_next; ptr != edge; ptr = ptr->m_twin->m_next) {
			if (ptr->m_incidentFace > 0) {
				hacd::HaI32 i0 = ptr->m_next->m_incidentVertex;
				const dgBigVector& p1 = pool[i0];

				hacd::HaI32 i1 = ptr->m_prev->m_incidentVertex;
				const dgBigVector& p2 = pool[i1];

				dgBigVector e0 (p1 - p0);
				dgBigVector e1 (p2 - p1);
				dgBigVector e2 (p0 - p2);

				hacd::HaF64 mag0 = e0 % e0;
				hacd::HaF64 mag1 = e1 % e1;
				hacd::HaF64 mag2 = e2 % e2;
				hacd::HaF64 maxMag = GetMax (mag0, mag1, mag2);
				hacd::HaF64 minMag = GetMin (mag0, mag1, mag2);
				hacd::HaF64 ratio = minMag / maxMag;

				if (ratio < aspect) {
					aspect = ratio;
				}
			}
		}
		aspect = sqrt (aspect);
		//aspect = 1.0f;
	}

	return aspect;
}